

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O3

void __thiscall xray_re::xr_spawn_object::save(xr_spawn_object *this,xr_writer *w)

{
  undefined1 *data;
  int iVar1;
  cse_abstract *pcVar2;
  uint16_t version;
  xr_packet packet;
  undefined2 local_1036;
  undefined4 local_1034;
  undefined1 local_1030 [16];
  pointer local_1020;
  undefined4 local_28;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  local_1036 = 0x14;
  xr_writer::w_raw_chunk(w,0xe411,&local_1036,2,false);
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    local_1030._0_8_ = operator_new(8);
    local_1030._8_8_ = local_1030._0_8_ + 8;
    *(xr_custom_object **)local_1030._0_8_ = this->m_attached_object;
    local_1020 = (pointer)local_1030._8_8_;
    xr_scene::save_objects
              ((this->super_xr_custom_object).m_scene,w,0xe421,(xr_custom_object_vec *)local_1030);
    if ((pointer)local_1030._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1030._0_8_,(long)local_1020 - local_1030._0_8_);
    }
  }
  if (*(int *)&(this->super_xr_custom_object).field_0x6c == 2) {
    pcVar2 = (this->field_1).m_entity;
    if (pcVar2 == (cse_abstract *)0x0) {
      __assert_fail("m_entity",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x73,"virtual void xray_re::xr_spawn_object::save(xr_writer &) const");
    }
    xr_writer::open_chunk(w,0xe419);
    xr_writer::w_sz(w,&pcVar2->m_s_name);
    xr_writer::close_chunk(w);
    xr_writer::open_chunk(w,0xe420);
    xr_packet::xr_packet((xr_packet *)local_1030);
    cse_abstract::spawn_write((this->field_1).m_entity,(xr_packet *)local_1030,true);
    local_1034 = local_28;
    (*w->_vptr_xr_writer[2])(w,&local_1034,4);
    xr_writer::w_packet(w,(xr_packet *)local_1030);
  }
  else {
    data = &(this->super_xr_custom_object).field_0x6c;
    xr_writer::w_raw_chunk(w,0xe417,data,4,false);
    iVar1 = *(int *)data;
    if (iVar1 == 1) {
      xr_writer::open_chunk(w,0xe422);
      local_1030._0_4_ = (this->field_1).field_1.m_radius;
      (*w->_vptr_xr_writer[2])(w,local_1030,4);
      local_1030._0_4_ = (this->field_1).field_1.m_power;
      (*w->_vptr_xr_writer[2])(w,local_1030,4);
      local_1030._0_4_ = (this->field_1).field_1.m_view_distance;
      (*w->_vptr_xr_writer[2])(w,local_1030,4);
      local_1030._0_4_ = (this->field_1).field_1.m_fog_color;
      (*w->_vptr_xr_writer[2])(w,local_1030,4);
      local_1030._0_4_ = (this->field_1).field_1.m_fog_density;
      (*w->_vptr_xr_writer[2])(w,local_1030,4);
      local_1030._0_4_ = (this->field_1).field_1.m_ambient_color;
      (*w->_vptr_xr_writer[2])(w,local_1030,4);
      local_1030._0_4_ = (this->field_1).field_1.m_sky_color;
      (*w->_vptr_xr_writer[2])(w,local_1030,4);
      xr_writer::close_chunk(w);
      xr_writer::w_raw_chunk(w,0xe423,(void *)((long)&this->field_1 + 0x1c),4,false);
      return;
    }
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x91,"virtual void xray_re::xr_spawn_object::save(xr_writer &) const");
    }
    xr_writer::open_chunk(w,0xe413);
    local_1030[0] = (this->field_1).field_0.m_team;
    (*w->_vptr_xr_writer[2])(w,local_1030,1);
    local_1030[0] = (this->field_1).field_0.m_respawn;
    (*w->_vptr_xr_writer[2])(w,local_1030,1);
    local_1030[0] = (this->field_1).field_0.m_game;
    (*w->_vptr_xr_writer[2])(w,local_1030,1);
    local_1030._0_8_ = (ulong)(uint7)local_1030._1_7_ << 8;
    (*w->_vptr_xr_writer[2])(w,local_1030,1);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_spawn_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);

	uint16_t version = SPAWNPOINT_VERSION;
	w.w_chunk<uint16_t>(SPAWNPOINT_CHUNK_VERSION, version);

	if (m_attached_object) {
		xr_custom_object_vec objects(1, m_attached_object);
		scene().save_objects(w, SPAWNPOINT_CHUNK_ATTACHED_OBJECT, objects);
	}
	if (m_type == SPAWNPOINT_TYPE_ENTITY) {
		xr_assert(m_entity);
		w.w_chunk(SPAWNPOINT_CHUNK_SECTION, m_entity->name());

		w.open_chunk(SPAWNPOINT_CHUNK_SPAWNDATA);
		xr_packet packet;
		m_entity->spawn_write(packet, true);
		w.w_size_u32(packet.w_tell());
		w.w_packet(packet);
		w.close_chunk();
	} else {
		w.w_chunk(SPAWNPOINT_CHUNK_TYPE, m_type);
		if (m_type == SPAWNPOINT_TYPE_RPOINT) {
			w.open_chunk(SPAWNPOINT_CHUNK_RPOINT_PARAMS);
			w.w_u8(m_team);
			w.w_u8(m_respawn);
			w.w_u8(m_game);
			w.w_u8(0);
			w.close_chunk();
		} else if (m_type == SPAWNPOINT_TYPE_ENV_MOD) {
			w.open_chunk(SPAWNPOINT_CHUNK_ENV_MOD_PARAMS);
			w.w_float(m_radius);
			w.w_float(m_power);
			w.w_float(m_view_distance);
			w.w_u32(m_fog_color);
			w.w_float(m_fog_density);
			w.w_u32(m_ambient_color);
			w.w_u32(m_sky_color);
			w.close_chunk();
			w.w_chunk<uint32_t>(SPAWNPOINT_CHUNK_ENV_MOD_HEMI, m_hemi_color);
		} else {
			xr_not_expected();
		}
	}
}